

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read.c
# Opt level: O3

la_ssize_t archive_read_data(archive *_a,void *buff,size_t s)

{
  size_t *s_00;
  int iVar1;
  long lVar2;
  long lVar3;
  size_t __n;
  ulong __n_00;
  la_ssize_t lVar4;
  void *read_buf;
  char *local_38;
  
  if (s == 0) {
    lVar4 = 0;
  }
  else {
    s_00 = &_a->read_data_remaining;
    lVar3 = _a->read_data_output_offset;
    lVar4 = 0;
    do {
      lVar2 = _a->read_data_offset;
      if (lVar2 == lVar3) {
        lVar2 = lVar3;
        if (*s_00 == 0) {
          local_38 = _a->read_data_block;
          _a->read_data_is_posix_read = '\x01';
          _a->read_data_requested = s;
          iVar1 = archive_read_data_block(_a,&local_38,s_00,&_a->read_data_offset);
          _a->read_data_block = local_38;
          if (iVar1 == 1) {
            return lVar4;
          }
          if (iVar1 < 0) {
            return (long)iVar1;
          }
          lVar2 = _a->read_data_offset;
          lVar3 = _a->read_data_output_offset;
          goto LAB_00229b2a;
        }
      }
      else {
LAB_00229b2a:
        if (lVar2 < lVar3) {
          archive_set_error(_a,0x54,"Encountered out-of-order sparse blocks");
          return -10;
        }
      }
      __n = lVar2 - lVar3;
      if (__n == 0 || lVar2 < lVar3) {
        __n = 0;
      }
      if ((long)(lVar3 + s) < lVar2) {
        __n = s;
      }
      memset(buff,0,__n);
      lVar3 = _a->read_data_output_offset + __n;
      lVar4 = lVar4 + __n;
      _a->read_data_output_offset = lVar3;
      s = s - __n;
      if (s == 0) break;
      buff = (void *)((long)buff + __n);
      __n_00 = *s_00;
      if (__n_00 != 0) {
        if (s <= __n_00) {
          __n_00 = s;
        }
        memcpy(buff,_a->read_data_block,__n_00);
        _a->read_data_block = _a->read_data_block + __n_00;
        _a->read_data_remaining = _a->read_data_remaining - __n_00;
        lVar3 = _a->read_data_output_offset + __n_00;
        _a->read_data_output_offset = lVar3;
        _a->read_data_offset = _a->read_data_offset + __n_00;
        s = s - __n_00;
        buff = (void *)((long)buff + __n_00);
        lVar4 = lVar4 + __n_00;
      }
    } while (s != 0);
  }
  _a->read_data_is_posix_read = '\0';
  _a->read_data_requested = 0;
  return lVar4;
}

Assistant:

la_ssize_t
archive_read_data(struct archive *_a, void *buff, size_t s)
{
	struct archive *a = (struct archive *)_a;
	char	*dest;
	const void *read_buf;
	size_t	 bytes_read;
	size_t	 len;
	int	 r;

	bytes_read = 0;
	dest = (char *)buff;

	while (s > 0) {
		if (a->read_data_offset == a->read_data_output_offset &&
		    a->read_data_remaining == 0) {
			read_buf = a->read_data_block;
			a->read_data_is_posix_read = 1;
			a->read_data_requested = s;
			r = archive_read_data_block(a, &read_buf,
			    &a->read_data_remaining, &a->read_data_offset);
			a->read_data_block = read_buf;
			if (r == ARCHIVE_EOF)
				return (bytes_read);
			/*
			 * Error codes are all negative, so the status
			 * return here cannot be confused with a valid
			 * byte count.  (ARCHIVE_OK is zero.)
			 */
			if (r < ARCHIVE_OK)
				return (r);
		}

		if (a->read_data_offset < a->read_data_output_offset) {
			archive_set_error(a, ARCHIVE_ERRNO_FILE_FORMAT,
			    "Encountered out-of-order sparse blocks");
			return (ARCHIVE_RETRY);
		}

		/* Compute the amount of zero padding needed. */
		if (a->read_data_output_offset + (int64_t)s <
		    a->read_data_offset) {
			len = s;
		} else if (a->read_data_output_offset <
		    a->read_data_offset) {
			len = (size_t)(a->read_data_offset -
			    a->read_data_output_offset);
		} else
			len = 0;

		/* Add zeroes. */
		memset(dest, 0, len);
		s -= len;
		a->read_data_output_offset += len;
		dest += len;
		bytes_read += len;

		/* Copy data if there is any space left. */
		if (s > 0) {
			len = a->read_data_remaining;
			if (len > s)
				len = s;
			if (len) {
				memcpy(dest, a->read_data_block, len);
				s -= len;
				a->read_data_block += len;
				a->read_data_remaining -= len;
				a->read_data_output_offset += len;
				a->read_data_offset += len;
				dest += len;
				bytes_read += len;
			}
		}
	}
	a->read_data_is_posix_read = 0;
	a->read_data_requested = 0;
	return (bytes_read);
}